

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O1

char * cmd_launch(skynet_context *context,char *param)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *param_00;
  skynet_context *psVar4;
  byte bVar5;
  long lVar6;
  undefined8 uStack_30;
  char *local_28;
  char *args;
  
  uStack_30 = 0x114a0c;
  sVar2 = strlen(param);
  lVar6 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar6) = 0x114a28;
  strcpy((char *)((long)&local_28 + lVar6),param);
  local_28 = (char *)((long)&local_28 + lVar6);
  *(undefined8 *)((long)&uStack_30 + lVar6) = 0x114a3e;
  pcVar3 = strsep(&local_28," \t\r\n");
  *(undefined8 *)((long)&uStack_30 + lVar6) = 0x114a50;
  param_00 = strsep(&local_28,"\r\n");
  local_28 = param_00;
  *(undefined8 *)((long)&uStack_30 + lVar6) = 0x114a5e;
  psVar4 = skynet_context_new(pcVar3,param_00);
  if (psVar4 == (skynet_context *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = context->result;
    uVar1 = psVar4->handle;
    context->result[0] = ':';
    bVar5 = 0x1c;
    lVar6 = 0;
    do {
      context->result[lVar6 + 1] = id_to_hex_hex[uVar1 >> (bVar5 & 0x1f) & 0xf];
      lVar6 = lVar6 + 1;
      bVar5 = bVar5 - 4;
    } while (lVar6 != 8);
    context->result[9] = '\0';
  }
  return pcVar3;
}

Assistant:

static const char *
cmd_launch(struct skynet_context * context, const char * param) {
	size_t sz = strlen(param);
	char tmp[sz+1];
	strcpy(tmp,param);
	char * args = tmp;
	char * mod = strsep(&args, " \t\r\n");
	args = strsep(&args, "\r\n");
	struct skynet_context * inst = skynet_context_new(mod,args);
	if (inst == NULL) {
		return NULL;
	} else {
		id_to_hex(context->result, inst->handle);
		return context->result;
	}
}